

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

int __thiscall glslang::TProgram::link(TProgram *this,char *__from,char *__to)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int s;
  EShLanguage stage;
  
  stage = EShLangVertex;
  uVar4 = 0;
  if (this->linked == false) {
    this->linked = true;
    SetThreadPoolAllocator(this->pool);
    bVar3 = false;
    do {
      bVar1 = linkStage(this,stage,(EShMessages)__from);
      if (!bVar1) {
        bVar3 = true;
      }
      stage = stage + EShLangTessControl;
    } while (stage != EShLangCount);
    bVar1 = bVar3;
    if (!bVar3) {
      bVar2 = crossStageCheck(this,(EShMessages)__from);
      bVar1 = true;
      if (bVar2) {
        bVar1 = bVar3;
      }
    }
    uVar4 = bVar1 ^ 1;
  }
  return uVar4;
}

Assistant:

bool TProgram::link(EShMessages messages)
{
    if (linked)
        return false;
    linked = true;

    bool error = false;

    SetThreadPoolAllocator(pool);

    for (int s = 0; s < EShLangCount; ++s) {
        if (! linkStage((EShLanguage)s, messages))
            error = true;
    }

    if (!error) {
        if (! crossStageCheck(messages))
            error = true;
    }

    return ! error;
}